

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void sym_Init(time_t now)

{
  Symbol *pSVar1;
  char *value;
  tm *ptVar2;
  Symbol *sym_13;
  Symbol *sym_12;
  Symbol *sym_11;
  Symbol *sym_10;
  Symbol *sym_9;
  Symbol *sym_8;
  Symbol *sym_7;
  Symbol *sym_6;
  Symbol *sym_5;
  Symbol *sym_4;
  tm *time_utc;
  tm *time_local;
  Symbol *sym_3;
  Symbol *sym_2;
  Symbol *sym_1;
  Symbol *sym;
  time_t now_local;
  
  sym = (Symbol *)now;
  PCSymbol = createBuiltinSymbol("@");
  PCSymbol->type = SYM_LABEL;
  PCSymbol->section = (Section *)0x0;
  (PCSymbol->field_8).numCallback = CallbackPC;
  _NARGSymbol = createBuiltinSymbol("_NARG");
  _NARGSymbol->type = SYM_EQU;
  (_NARGSymbol->field_8).numCallback = Callback_NARG;
  pSVar1 = sym_AddVar("_RS",0);
  pSVar1->isBuiltin = true;
  value = get_package_version_string();
  pSVar1 = sym_AddString("__RGBDS_VERSION__",value);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x292,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  pSVar1 = sym_AddEqu("__RGBDS_MAJOR__",0);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x293,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  pSVar1 = sym_AddEqu("__RGBDS_MINOR__",6);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x294,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  pSVar1 = sym_AddEqu("__RGBDS_PATCH__",1);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x295,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  if (sym == (Symbol *)0xffffffffffffffff) {
    warn("Couldn\'t determine current time");
    sym = (Symbol *)0x0;
  }
  ptVar2 = localtime((time_t *)&sym);
  strftime(savedTIME,0x100,"\"%H:%M:%S\"",ptVar2);
  strftime(savedDATE,0x100,"\"%d %B %Y\"",ptVar2);
  strftime(savedTIMESTAMP_ISO8601_LOCAL,0x100,"\"%Y-%m-%dT%H:%M:%S%z\"",ptVar2);
  ptVar2 = gmtime((time_t *)&sym);
  strftime(savedTIMESTAMP_ISO8601_UTC,0x100,"\"%Y-%m-%dT%H:%M:%SZ\"",ptVar2);
  pSVar1 = sym_AddString("__TIME__",savedTIME);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2ae,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  pSVar1 = sym_AddString("__DATE__",savedDATE);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2af,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  pSVar1 = sym_AddString("__ISO_8601_LOCAL__",savedTIMESTAMP_ISO8601_LOCAL);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b0,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  pSVar1 = sym_AddString("__ISO_8601_UTC__",savedTIMESTAMP_ISO8601_UTC);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b1,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  pSVar1 = sym_AddEqu("__UTC_YEAR__",ptVar2->tm_year + 0x76c);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b3,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  pSVar1 = sym_AddEqu("__UTC_MONTH__",ptVar2->tm_mon + 1);
  if (pSVar1 == (Symbol *)0x0) {
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b4,"sym_Init");
  }
  pSVar1->isBuiltin = true;
  pSVar1 = sym_AddEqu("__UTC_DAY__",ptVar2->tm_mday);
  if (pSVar1 != (Symbol *)0x0) {
    pSVar1->isBuiltin = true;
    pSVar1 = sym_AddEqu("__UTC_HOUR__",ptVar2->tm_hour);
    if (pSVar1 == (Symbol *)0x0) {
      __assert_fail("sym",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                    ,0x2b6,"sym_Init");
    }
    pSVar1->isBuiltin = true;
    pSVar1 = sym_AddEqu("__UTC_MINUTE__",ptVar2->tm_min);
    if (pSVar1 != (Symbol *)0x0) {
      pSVar1->isBuiltin = true;
      pSVar1 = sym_AddEqu("__UTC_SECOND__",ptVar2->tm_sec);
      if (pSVar1 != (Symbol *)0x0) {
        pSVar1->isBuiltin = true;
        sym_SetCurrentSymbolScope((char *)0x0);
        anonLabelID = 0;
        return;
      }
      __assert_fail("sym",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                    ,0x2b8,"sym_Init");
    }
    __assert_fail("sym",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x2b7,"sym_Init");
  }
  __assert_fail("sym",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                ,0x2b5,"sym_Init");
}

Assistant:

void sym_Init(time_t now)
{
	PCSymbol = createBuiltinSymbol("@");
	PCSymbol->type = SYM_LABEL;
	PCSymbol->section = NULL;
	PCSymbol->numCallback = CallbackPC;

	_NARGSymbol = createBuiltinSymbol("_NARG");
	_NARGSymbol->type = SYM_EQU;
	_NARGSymbol->numCallback = Callback_NARG;

	sym_AddVar("_RS", 0)->isBuiltin = true;

#define addSym(fn, name, val) do { \
	struct Symbol *sym = fn(name, val); \
	assert(sym); \
	sym->isBuiltin = true; \
} while (0)
#define addNumber(name, val) addSym(sym_AddEqu, name, val)
#define addString(name, val) addSym(sym_AddString, name, val)

	addString("__RGBDS_VERSION__", get_package_version_string());
	addNumber("__RGBDS_MAJOR__", PACKAGE_VERSION_MAJOR);
	addNumber("__RGBDS_MINOR__", PACKAGE_VERSION_MINOR);
	addNumber("__RGBDS_PATCH__", PACKAGE_VERSION_PATCH);
#ifdef PACKAGE_VERSION_RC
	addNumber("__RGBDS_RC__", PACKAGE_VERSION_RC);
#endif

	if (now == (time_t)-1) {
		warn("Couldn't determine current time");
		// Fall back by pretending we are at the Epoch
		now = 0;
	}

	const struct tm *time_local = localtime(&now);

	strftime(savedTIME, sizeof(savedTIME), "\"%H:%M:%S\"", time_local);
	strftime(savedDATE, sizeof(savedDATE), "\"%d %B %Y\"", time_local);
	strftime(savedTIMESTAMP_ISO8601_LOCAL,
		 sizeof(savedTIMESTAMP_ISO8601_LOCAL), "\"%Y-%m-%dT%H:%M:%S%z\"",
		 time_local);

	const struct tm *time_utc = gmtime(&now);

	strftime(savedTIMESTAMP_ISO8601_UTC,
		 sizeof(savedTIMESTAMP_ISO8601_UTC), "\"%Y-%m-%dT%H:%M:%SZ\"",
		 time_utc);

	addString("__TIME__", savedTIME);
	addString("__DATE__", savedDATE);
	addString("__ISO_8601_LOCAL__", savedTIMESTAMP_ISO8601_LOCAL);
	addString("__ISO_8601_UTC__", savedTIMESTAMP_ISO8601_UTC);

	addNumber("__UTC_YEAR__", time_utc->tm_year + 1900);
	addNumber("__UTC_MONTH__", time_utc->tm_mon + 1);
	addNumber("__UTC_DAY__", time_utc->tm_mday);
	addNumber("__UTC_HOUR__", time_utc->tm_hour);
	addNumber("__UTC_MINUTE__", time_utc->tm_min);
	addNumber("__UTC_SECOND__", time_utc->tm_sec);

#undef addNumber
#undef addString
#undef addSym

	sym_SetCurrentSymbolScope(NULL);
	anonLabelID = 0;
}